

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

void __thiscall wallet::PageHeader::Unserialize<AutoFile>(PageHeader *this,AutoFile *s)

{
  long lVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  runtime_error *prVar4;
  uint32_t *in_RDI;
  long in_FS_OFFSET;
  uint8_t uint8_type;
  uint32_t in_stack_ffffffffffffffac;
  uint16_t x;
  uint *in_stack_ffffffffffffffb0;
  AutoFile *in_stack_ffffffffffffffb8;
  undefined1 local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::operator>>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  AutoFile::operator>>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  AutoFile::operator>>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  AutoFile::operator>>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  AutoFile::operator>>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  AutoFile::operator>>(in_stack_ffffffffffffffb8,(unsigned_short *)in_stack_ffffffffffffffb0);
  AutoFile::operator>>(in_stack_ffffffffffffffb8,(unsigned_short *)in_stack_ffffffffffffffb0);
  AutoFile::operator>>(in_stack_ffffffffffffffb8,(uchar *)in_stack_ffffffffffffffb0);
  AutoFile::operator>>(in_stack_ffffffffffffffb8,(uchar *)in_stack_ffffffffffffffb0);
  *(undefined1 *)((long)in_RDI + 0x19) = local_9;
  if ((in_RDI[8] & 1) != 0) {
    uVar3 = internal_bswap_32(in_stack_ffffffffffffffac);
    *in_RDI = uVar3;
    uVar3 = internal_bswap_32(in_stack_ffffffffffffffac);
    in_RDI[1] = uVar3;
    uVar3 = internal_bswap_32(in_stack_ffffffffffffffac);
    in_RDI[2] = uVar3;
    uVar3 = internal_bswap_32(in_stack_ffffffffffffffac);
    in_RDI[3] = uVar3;
    uVar3 = internal_bswap_32(in_stack_ffffffffffffffac);
    in_RDI[4] = uVar3;
    x = (uint16_t)(in_stack_ffffffffffffffac >> 0x10);
    uVar2 = internal_bswap_16(x);
    *(uint16_t *)(in_RDI + 5) = uVar2;
    uVar2 = internal_bswap_16(x);
    *(uint16_t *)((long)in_RDI + 0x16) = uVar2;
  }
  if (in_RDI[7] == in_RDI[2]) {
    if (((*(char *)((long)in_RDI + 0x19) == '\a') || ((char)in_RDI[6] != '\0')) &&
       ((*(char *)((long)in_RDI + 0x19) != '\a' || ((char)in_RDI[6] == '\0')))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
    else {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Bad btree level");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Page number mismatch");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> lsn_file;
        s >> lsn_offset;
        s >> page_num;
        s >> prev_page;
        s >> next_page;
        s >> entries;
        s >> hf_offset;
        s >> level;

        uint8_t uint8_type;
        s >> uint8_type;
        type = static_cast<PageType>(uint8_type);

        if (other_endian) {
            lsn_file = internal_bswap_32(lsn_file);
            lsn_offset = internal_bswap_32(lsn_offset);
            page_num = internal_bswap_32(page_num);
            prev_page = internal_bswap_32(prev_page);
            next_page = internal_bswap_32(next_page);
            entries = internal_bswap_16(entries);
            hf_offset = internal_bswap_16(hf_offset);
        }

        if (expected_page_num != page_num) {
            throw std::runtime_error("Page number mismatch");
        }
        if ((type != PageType::OVERFLOW_DATA && level < 1) || (type == PageType::OVERFLOW_DATA && level != 0)) {
            throw std::runtime_error("Bad btree level");
        }
    }